

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O1

void __thiscall
pbrt::ParsedScene::Attribute
          (ParsedScene *this,string *target,ParsedParameterVector attrib,FileLoc loc)

{
  long lVar1;
  GraphicsState *pGVar2;
  int iVar3;
  long in_RDX;
  long lVar4;
  long lVar5;
  long lVar6;
  string local_50;
  
  if (this->currentApiState == Uninitialized) {
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    detail::stringPrintfRecursive<char_const(&)[10]>
              (&local_50,"pbrtInit() must be before calling \"%s()\". Ignoring.",
               (char (*) [10])0x2f67c9c);
    Error((FileLoc *)&attrib,local_50._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)target);
    if (iVar3 == 0) {
      lVar6 = 0x118;
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)target);
      if (iVar3 == 0) {
        lVar6 = 0x178;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)target);
        if (iVar3 == 0) {
          lVar6 = 0x1d8;
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)target);
          if (iVar3 == 0) {
            lVar6 = 0x238;
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)target);
            if (iVar3 != 0) {
              SceneRepresentation::ErrorExitDeferred<std::__cxx11::string_const&>
                        (&this->super_SceneRepresentation,(FileLoc *)&attrib,
                         "Unknown attribute target \"%s\". Must be \"shape\", \"light\", \"material\", \"medium\", or \"texture\"."
                         ,target);
              return;
            }
            lVar6 = 0x298;
          }
        }
      }
    }
    lVar1 = *(long *)(in_RDX + 0x58);
    lVar5 = in_RDX + 0x10;
    if (*(long *)(in_RDX + 8) != 0) {
      lVar5 = *(long *)(in_RDX + 8);
    }
    if (lVar1 != 0) {
      pGVar2 = this->graphicsState;
      lVar4 = 0;
      do {
        local_50._M_dataplus._M_p = *(pointer *)(lVar5 + lVar4);
        local_50._M_dataplus._M_p[200] = '\x01';
        *(RGBColorSpace **)(local_50._M_dataplus._M_p + 0xc0) = this->graphicsState->colorSpace;
        InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
        ::push_back((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                     *)((long)&(pGVar2->currentInsideMedium)._M_dataplus._M_p + lVar6),
                    (ParsedParameter **)&local_50);
        lVar4 = lVar4 + 8;
      } while (lVar1 << 3 != lVar4);
    }
  }
  return;
}

Assistant:

void ParsedScene::Attribute(const std::string &target, ParsedParameterVector attrib,
                            FileLoc loc) {
    VERIFY_INITIALIZED("Attribute");

    ParsedParameterVector *currentAttributes = nullptr;
    if (target == "shape") {
        currentAttributes = &graphicsState->shapeAttributes;
    } else if (target == "light") {
        currentAttributes = &graphicsState->lightAttributes;
    } else if (target == "material") {
        currentAttributes = &graphicsState->materialAttributes;
    } else if (target == "medium") {
        currentAttributes = &graphicsState->mediumAttributes;
    } else if (target == "texture") {
        currentAttributes = &graphicsState->textureAttributes;
    } else {
        ErrorExitDeferred(
            &loc,
            "Unknown attribute target \"%s\". Must be \"shape\", \"light\", "
            "\"material\", \"medium\", or \"texture\".",
            target);
        return;
    }

    // Note that we hold on to the current color space and associate it
    // with the parameters...
    for (ParsedParameter *p : attrib) {
        p->mayBeUnused = true;
        p->colorSpace = graphicsState->colorSpace;
        currentAttributes->push_back(p);
    }
}